

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotShadedEx<ImPlot::GetterYs<signed_char>,ImPlot::GetterYRef>
               (char *label_id,GetterYs<signed_char> *getter1,GetterYRef *getter2,bool fit2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  ImPlotPlot *pIVar11;
  ImPlotRange *pIVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  int iVar15;
  ImU32 col;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  byte bVar16;
  int iVar17;
  uint uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  TransformerLinLin local_84;
  GetterYRef *local_80;
  GetterYs<signed_char> *local_78;
  undefined4 local_6c;
  uint local_68;
  uint local_64;
  ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar14 = BeginItem(label_id,1);
  pIVar13 = GImPlot;
  if (bVar14) {
    if (GImPlot->FitThisFrame == true) {
      local_6c = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar15 = getter1->Count;
      if (0 < iVar15) {
        dVar1 = getter1->X0;
        dVar2 = getter1->XScale;
        pcVar10 = getter1->Ys;
        iVar5 = getter1->Offset;
        iVar6 = getter1->Stride;
        pIVar11 = GImPlot->CurrentPlot;
        iVar7 = pIVar11->CurrentYAxis;
        uVar8 = (pIVar11->XAxis).Flags;
        pIVar12 = GImPlot->ExtentsY;
        uVar9 = pIVar11->YAxis[iVar7].Flags;
        iVar17 = 0;
        uVar18 = uVar9 & 0x20;
        local_64 = uVar18 >> 5;
        local_68 = uVar8 & 0x20;
        dVar19 = 0.0;
        do {
          dVar21 = dVar2 * dVar19 + dVar1;
          cVar4 = pcVar10[(long)(((iVar5 + iVar17) % iVar15 + iVar15) % iVar15) * (long)iVar6];
          dVar20 = (double)(int)cVar4;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001e8c1e:
              if ((0.0 < dVar21) || (local_68 == 0)) {
                dVar3 = (pIVar13->ExtentsX).Min;
                dVar22 = dVar21;
                if (dVar3 <= dVar21) {
                  dVar22 = dVar3;
                }
                (pIVar13->ExtentsX).Min = dVar22;
                dVar3 = (pIVar13->ExtentsX).Max;
                dVar22 = dVar21;
                if (dVar21 <= dVar3) {
                  dVar22 = dVar3;
                }
                (pIVar13->ExtentsX).Max = dVar22;
              }
            }
          }
          else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                   (pIVar11->YAxis[iVar7].Range.Min <= dVar20)) &&
                  (dVar20 <= pIVar11->YAxis[iVar7].Range.Max)) goto LAB_001e8c1e;
          if ((uVar9 >> 10 & 1) == 0) {
            if (('\0' < cVar4) || (uVar18 == 0)) {
LAB_001e8c87:
              dVar21 = pIVar12[iVar7].Min;
              dVar3 = dVar20;
              if (dVar21 <= dVar20) {
                dVar3 = dVar21;
              }
              pIVar12[iVar7].Min = dVar3;
              dVar21 = pIVar13->ExtentsY[iVar7].Max;
              if (dVar20 <= dVar21) {
                dVar20 = dVar21;
              }
              pIVar13->ExtentsY[iVar7].Max = dVar20;
            }
          }
          else if ((((pIVar11->XAxis).Range.Min <= dVar21) && (dVar21 <= (pIVar11->XAxis).Range.Max)
                   ) && ((cVar4 < '\x01' & (byte)local_64) == 0)) goto LAB_001e8c87;
          dVar19 = dVar19 + 1.0;
          iVar17 = iVar17 + 1;
        } while (iVar15 != iVar17);
      }
      if ((fit2) && (iVar15 = getter2->Count, 0 < iVar15)) {
        dVar1 = getter2->X0;
        dVar2 = getter2->YRef;
        dVar19 = getter2->XScale;
        pIVar11 = pIVar13->CurrentPlot;
        iVar5 = pIVar11->CurrentYAxis;
        uVar8 = (pIVar11->XAxis).Flags;
        uVar9 = pIVar11->YAxis[iVar5].Flags;
        pIVar12 = pIVar13->ExtentsY + iVar5;
        bVar16 = dVar2 <= 0.0 & (byte)((uVar9 & 0x20) >> 5);
        dVar20 = 0.0;
        do {
          dVar21 = dVar19 * dVar20 + dVar1;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001e8d9b:
              if ((0.0 < dVar21) || ((uVar8 & 0x20) == 0)) {
                dVar3 = (pIVar13->ExtentsX).Min;
                dVar22 = dVar21;
                if (dVar3 <= dVar21) {
                  dVar22 = dVar3;
                }
                (pIVar13->ExtentsX).Min = dVar22;
                dVar3 = (pIVar13->ExtentsX).Max;
                dVar22 = dVar21;
                if (dVar21 <= dVar3) {
                  dVar22 = dVar3;
                }
                (pIVar13->ExtentsX).Max = dVar22;
              }
            }
          }
          else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                   (pIVar11->YAxis[iVar5].Range.Min <= dVar2)) &&
                  (dVar2 <= pIVar11->YAxis[iVar5].Range.Max)) goto LAB_001e8d9b;
          if ((uVar9 >> 10 & 1) == 0) {
            if ((ulong)ABS(dVar2) < 0x7ff0000000000000 && bVar16 == 0) {
LAB_001e8dde:
              dVar21 = dVar2;
              if (pIVar12->Min <= dVar2) {
                dVar21 = pIVar12->Min;
              }
              pIVar12->Min = dVar21;
              dVar21 = dVar2;
              if (dVar2 <= pIVar12->Max) {
                dVar21 = pIVar12->Max;
              }
              pIVar12->Max = dVar21;
            }
          }
          else if (((ulong)ABS(dVar2) < 0x7ff0000000000000 && bVar16 == 0) &&
                   ((pIVar11->XAxis).Range.Min <= dVar21 && dVar21 <= (pIVar11->XAxis).Range.Max))
          goto LAB_001e8dde;
          dVar20 = dVar20 + 1.0;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
    }
    local_80 = getter2;
    local_78 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar13->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 1);
      switch(GImPlot->Scales[GImPlot->CurrentPlot->CurrentYAxis]) {
      case 0:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_78,local_80,&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<signed_char>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                          *)&local_60,local_78,local_80,(TransformerLogLin *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<signed_char>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                          *)&local_60,local_78,local_80,(TransformerLinLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<signed_char>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                          *)&local_60,local_78,local_80,(TransformerLogLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<signed_char>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar13 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}